

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expertInline.hpp
# Opt level: O0

Scal __thiscall LinearExpert<1,_1>::queryZ(LinearExpert<1,_1> *this,Z *z)

{
  double dVar1;
  MatrixBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> *in_RDI;
  double dVar2;
  ReturnType RVar3;
  double dVar4;
  type tVar5;
  double dVar6;
  Product<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::Matrix<double,_1,_1,_0,_1,_1>,_0> PVar7;
  Z dzAux;
  Scal aux3;
  Z aux2;
  Scal aux1;
  Scal dof;
  MatrixBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> *in_stack_fffffffffffffea8;
  MatrixBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> *in_stack_fffffffffffffeb0;
  MatrixBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> *this_00;
  MatrixBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> *in_stack_fffffffffffffed8;
  DenseBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> *this_01;
  StorageBaseType *in_stack_fffffffffffffef0;
  MatrixBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> *in_stack_fffffffffffffef8;
  
  Eigen::MatrixBase<Eigen::Matrix<double,1,1,0,1,1>>::operator-(in_stack_fffffffffffffed8,in_RDI);
  Eigen::Matrix<double,1,1,0,1,1>::operator=
            ((Matrix<double,_1,_1,_0,_1,_1> *)in_stack_fffffffffffffeb0,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
              *)in_stack_fffffffffffffea8);
  Eigen::MatrixBase<Eigen::Matrix<double,1,1,0,1,1>>::operator*
            (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Matrix<double,1,1,0,1,1>,Eigen::Matrix<double,1,1,0,1,1>,0>>::
  operator+((MatrixBase<Eigen::Product<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::Matrix<double,_1,_1,_0,_1,_1>,_0>_>
             *)in_stack_fffffffffffffed8,in_RDI);
  Eigen::Matrix<double,1,1,0,1,1>::operator=
            ((Matrix<double,_1,_1,_0,_1,_1> *)in_stack_fffffffffffffeb0,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::Matrix<double,_1,_1,_0,_1,_1>,_0>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
              *)in_stack_fffffffffffffea8);
  dVar4 = *(double *)(in_RDI + 0x90);
  dVar6 = *(double *)(in_RDI + 0x40);
  dVar2 = ((*(double *)(in_RDI + 0x88) + *(double *)(in_RDI + 0x40) + 1.0) /
          (*(double *)(in_RDI + 0x88) + *(double *)(in_RDI + 0x40))) *
          (*(double *)(in_RDI + 0x90) + *(double *)(in_RDI + 0x40) + 1.0 +
          (double)(~-(ulong)(*(double *)(in_RDI + 0x88) == 0.0) & 0x4000000000000000 |
                  (ulong)((uint)(-(ulong)(*(double *)(in_RDI + 0x88) == 0.0) >> 0x20) & 0x3ff00000)
                  << 0x20));
  Eigen::MatrixBase<Eigen::Matrix<double,1,1,0,1,1>>::operator*
            (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  Eigen::Matrix<double,1,1,0,1,1>::
  Matrix<Eigen::Product<Eigen::Matrix<double,1,1,0,1,1>,Eigen::Matrix<double,1,1,0,1,1>,0>>
            ((Matrix<double,_1,_1,_0,_1,_1> *)in_stack_fffffffffffffeb0,
             (EigenBase<Eigen::Product<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::Matrix<double,_1,_1,_0,_1,_1>,_0>_>
              *)in_stack_fffffffffffffea8);
  RVar3 = Eigen::MatrixBase<Eigen::Matrix<double,1,1,0,1,1>>::dot<Eigen::Matrix<double,1,1,0,1,1>>
                    (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  *(ReturnType *)(in_RDI + 0x140) = RVar3;
  dVar1 = *(double *)(in_RDI + 0x140);
  Eigen::operator*((double *)in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
  Eigen::Matrix<double,1,1,0,1,1>::operator=
            ((Matrix<double,_1,_1,_0,_1,_1> *)in_stack_fffffffffffffeb0,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>_>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
              *)in_stack_fffffffffffffea8);
  dVar4 = pow(dVar1 / dVar2 + 1.0,(((dVar4 + dVar6) - 1.0) + 1.0 + 1.0) * -0.5);
  *(double *)(in_RDI + 200) = dVar4;
  this_00 = *(MatrixBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> **)(in_RDI + 0x148);
  tVar5 = boost::math::tgamma_delta_ratio<double,double>
                    ((double)this_00,(double)in_stack_fffffffffffffea8);
  dVar4 = (double)this_00 / tVar5;
  dVar6 = pow(2.0 / dVar2,0.5);
  *(double *)(in_RDI + 0xb0) = dVar4 * dVar6 * *(double *)(in_RDI + 200);
  Eigen::MatrixBase<Eigen::Matrix<double,1,1,0,1,1>>::operator/
            (in_stack_fffffffffffffef8,(double *)in_stack_fffffffffffffef0);
  Eigen::MatrixBase<Eigen::Matrix<double,1,1,0,1,1>>::operator-
            (in_stack_fffffffffffffed8,
             (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>_>
              *)in_RDI);
  Eigen::Matrix<double,1,1,0,1,1>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,1,1,0,1,1>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::Matrix<double,1,1,0,1,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,1,0,1,1>const>const>const>>
            ((Matrix<double,_1,_1,_0,_1,_1> *)this_00,
             (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>_>_>
              *)in_stack_fffffffffffffea8);
  PVar7 = Eigen::MatrixBase<Eigen::Matrix<double,1,1,0,1,1>>::operator*
                    (this_00,in_stack_fffffffffffffea8);
  this_01 = (DenseBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> *)PVar7.m_lhs;
  Eigen::Matrix<double,1,1,0,1,1>::operator=
            ((Matrix<double,_1,_1,_0,_1,_1> *)this_00,
             (DenseBase<Eigen::Product<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::Matrix<double,_1,_1,_0,_1,_1>,_0>_>
              *)in_stack_fffffffffffffea8);
  dVar4 = *(double *)
           ((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>_>
             *)in_RDI + 0x40);
  RVar3 = Eigen::MatrixBase<Eigen::Matrix<double,1,1,0,1,1>>::dot<Eigen::Matrix<double,1,1,0,1,1>>
                    (this_00,in_stack_fffffffffffffea8);
  *(double *)
   ((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>_>
     *)in_RDI + 0xf0) = 1.0 / dVar4 + RVar3;
  Eigen::DenseBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>::operator*=
            (this_01,(Scalar *)0x4000000000000000);
  return *(Scal *)((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>_>
                    *)in_RDI + 0xb0);
}

Assistant:

EXPERT_CLASS_TEMPLATE
Scal LINEAR_EXPERT_base::queryZ( Z const &z )
{
    dz = z - Nu;
    pred_x = Lambda * dz + Mu;

    Scal dof = wSigma + Sh - d + 1.0;
    Scal aux1 = (wNu + Sh + 1.0) / (wNu + Sh) * (wSigma + Sh + d + (wNu == 0.0 ? 1.0 : 2.0));

    Z aux2 = invSigma * dz;
    dz_invSigma_dz = dz.dot( aux2 );
    Scal aux3 = 1.0 + dz_invSigma_dz / aux1;
    kappa = ( (dof+d)/aux1/aux3 ) * aux2;

    rbf_z = pow(aux3 , -0.5*(dof+d) );
    p_z_T = sqrtDetInvSigma / boost::math::tgamma_delta_ratio(0.5*dof, 0.5*d) * pow(2.0/aux1, 0.5*d) * rbf_z;

    Z dzAux = z - Sz/Sh;
    dGamma = varLambda * dzAux;
    gamma = 1.0/Sh + dzAux.dot( dGamma );
    dGamma *= 2.0;

    return p_z_T;
}